

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O2

void kca_project_inertia(kca_joint *joint,ma_abi *m,ma_abi *r)

{
  frame *pfVar1;
  point *ppVar2;
  uint __line;
  char *__assertion;
  
  if (joint == (kca_joint *)0x0) {
    __assertion = "joint";
    __line = 0x6d;
  }
  else if (m == (ma_abi *)0x0) {
    __assertion = "m";
    __line = 0x6e;
  }
  else if (r == (ma_abi *)0x0) {
    __assertion = "r";
    __line = 0x6f;
  }
  else if (m == r) {
    __assertion = "m != r";
    __line = 0x70;
  }
  else {
    pfVar1 = m->frame;
    if (pfVar1 == (frame *)0x0) {
      __assertion = "m->frame";
      __line = 0x71;
    }
    else {
      ppVar2 = m->point;
      if (ppVar2 == pfVar1->origin) {
        if (joint->target_body == m->body) {
          if (joint->target_frame == pfVar1) {
            r->body = joint->reference_body;
            r->point = ppVar2;
            r->frame = pfVar1;
            return;
          }
          __assertion = "joint->target_frame == m->frame";
          __line = 0x74;
        }
        else {
          __assertion = "joint->target_body == m->body";
          __line = 0x73;
        }
      }
      else {
        __assertion = "m->point == m->frame->origin";
        __line = 0x72;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,__line,
                "void kca_project_inertia(const struct kca_joint *, const struct ma_abi *, struct ma_abi *)"
               );
}

Assistant:

void kca_project_inertia(
        const struct kca_joint *joint,
        const struct ma_abi *m,
        struct ma_abi *r)
{
    assert(joint);
    assert(m);
    assert(r);
    assert(m != r);
    assert(m->frame);
    assert(m->point == m->frame->origin);
    assert(joint->target_body == m->body);
    assert(joint->target_frame == m->frame);

    r->body = joint->reference_body;
    r->point = m->point;
    r->frame = m->frame;
}